

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

int gauden_var_thresh_percentile
              (vector_t ***var,float32 **var_thresh,uint32 n_mgau,uint32 n_stream,uint32 n_density,
              uint32 *veclen,float32 percent)

{
  float *pfVar1;
  int *piVar2;
  vector_t pfVar3;
  long lVar4;
  long lVar5;
  vector_t *ppfVar6;
  long lVar7;
  float32 *pfVar8;
  uint uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong n_elem;
  ulong uVar19;
  float fVar20;
  ulong local_60;
  
  n_elem = (ulong)n_stream;
  pvVar10 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73b);
  pvVar11 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73c);
  pvVar12 = __ckd_calloc__(n_elem,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                           ,0x73d);
  if (n_stream != 0) {
    uVar18 = 0;
    do {
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar18],8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x740);
      *(void **)((long)pvVar10 + uVar18 * 8) = pvVar13;
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar18],4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x741);
      *(void **)((long)pvVar11 + uVar18 * 8) = pvVar13;
      pvVar13 = __ckd_calloc__((ulong)veclen[uVar18],4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x742);
      *(void **)((long)pvVar12 + uVar18 * 8) = pvVar13;
      if (veclen[uVar18] != 0) {
        uVar19 = 0;
        do {
          pvVar13 = __ckd_calloc__(4000,4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                   ,0x744);
          *(void **)(*(long *)((long)pvVar10 + uVar18 * 8) + uVar19 * 8) = pvVar13;
          *(undefined4 *)(*(long *)((long)pvVar12 + uVar18 * 8) + uVar19 * 4) = 0x8082ab1e;
          *(undefined4 *)(*(long *)((long)pvVar11 + uVar18 * 8) + uVar19 * 4) = 0x7f7fc99e;
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar18]);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_elem);
  }
  if (n_mgau != 0) {
    uVar18 = 0;
    do {
      if (n_stream != 0) {
        uVar19 = 0;
        do {
          if (n_density != 0) {
            uVar9 = veclen[uVar19];
            uVar15 = 0;
            do {
              if ((ulong)uVar9 != 0) {
                pfVar3 = var[uVar18][uVar19][uVar15];
                lVar4 = *(long *)((long)pvVar12 + uVar19 * 8);
                uVar17 = 0;
                do {
                  fVar20 = pfVar3[uVar17];
                  pfVar1 = (float *)(lVar4 + uVar17 * 4);
                  if (*pfVar1 <= fVar20 && fVar20 != *pfVar1) {
                    *(float *)(lVar4 + uVar17 * 4) = fVar20;
                    fVar20 = pfVar3[uVar17];
                  }
                  if ((0.0 < fVar20) &&
                     (lVar5 = *(long *)((long)pvVar11 + uVar19 * 8),
                     fVar20 < *(float *)(lVar5 + uVar17 * 4))) {
                    *(float *)(lVar5 + uVar17 * 4) = fVar20;
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar9 != uVar17);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != n_density);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != n_elem);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_mgau);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x759,"var_extrema:\n");
  if (n_stream != 0) {
    uVar18 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",uVar18 & 0xffffffff);
      if (veclen[uVar18] != 0) {
        uVar19 = 0;
        do {
          err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t[%.4e %.4e]",
                  (double)*(float *)(*(long *)((long)pvVar11 + uVar18 * 8) + uVar19 * 4));
          uVar19 = uVar19 + 1;
        } while (uVar19 < veclen[uVar18]);
      }
      err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
      uVar18 = uVar18 + 1;
    } while (uVar18 != n_elem);
    if (n_stream != 0) {
      uVar18 = 0;
      do {
        uVar9 = veclen[uVar18];
        if ((ulong)uVar9 != 0) {
          lVar4 = *(long *)((long)pvVar12 + uVar18 * 8);
          lVar5 = *(long *)((long)pvVar11 + uVar18 * 8);
          uVar19 = 0;
          do {
            *(float *)(lVar4 + uVar19 * 4) =
                 (*(float *)(lVar4 + uVar19 * 4) - *(float *)(lVar5 + uVar19 * 4)) / 4000.0;
            uVar19 = uVar19 + 1;
          } while (uVar9 != uVar19);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != n_elem);
      if (n_stream != 0) {
        uVar18 = 0;
        do {
          uVar9 = veclen[uVar18];
          if (uVar9 != 0) {
            uVar19 = 0;
            do {
              if (n_mgau != 0) {
                local_60 = 0;
                do {
                  if (n_density != 0) {
                    ppfVar6 = var[local_60][uVar18];
                    uVar15 = 0;
                    do {
                      if (0.0 < ppfVar6[uVar15][uVar19]) {
                        fVar20 = floorf((ppfVar6[uVar15][uVar19] -
                                        *(float *)(*(long *)((long)pvVar11 + uVar18 * 8) +
                                                  uVar19 * 4)) /
                                        *(float *)(*(long *)((long)pvVar12 + uVar18 * 8) +
                                                  uVar19 * 4));
                        piVar2 = (int *)(*(long *)(*(long *)((long)pvVar10 + uVar18 * 8) +
                                                  uVar19 * 8) + ((long)fVar20 & 0xffffffffU) * 4);
                        *piVar2 = *piVar2 + 1;
                      }
                      uVar15 = uVar15 + 1;
                    } while (n_density != uVar15);
                  }
                  local_60 = local_60 + 1;
                } while (local_60 != n_mgau);
                uVar9 = veclen[uVar18];
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 < uVar9);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != n_elem);
        if (n_stream != 0) {
          uVar18 = 0;
          do {
            uVar9 = veclen[uVar18];
            if ((ulong)uVar9 != 0) {
              lVar4 = *(long *)((long)pvVar10 + uVar18 * 8);
              lVar5 = *(long *)((long)pvVar11 + uVar18 * 8);
              lVar7 = *(long *)((long)pvVar12 + uVar18 * 8);
              pfVar8 = var_thresh[uVar18];
              uVar19 = 0;
              do {
                lVar16 = 0;
                uVar14 = 0;
                do {
                  uVar14 = uVar14 + *(int *)(*(long *)(lVar4 + uVar19 * 8) + lVar16 * 4);
                  if ((float)percent / 100.0 < (float)uVar14 / (float)(n_density * n_mgau)) {
                    fVar20 = (float)((int)lVar16 + 1);
                    goto LAB_0011a5de;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 4000);
                fVar20 = 4001.0;
LAB_0011a5de:
                pfVar8[uVar19] =
                     (float32)(fVar20 * *(float *)(lVar7 + uVar19 * 4) +
                              *(float *)(lVar5 + uVar19 * 4));
                uVar19 = uVar19 + 1;
              } while (uVar19 != uVar9);
            }
            uVar18 = uVar18 + 1;
            if (uVar18 == n_elem) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x786,"var_extrema:\n");
              if (n_stream == 0) {
                return 0;
              }
              uVar18 = 0;
              do {
                err_msg(ERR_INFOCONT,(char *)0x0,0,"\tstream %u: ",uVar18 & 0xffffffff);
                if (veclen[uVar18] != 0) {
                  uVar19 = 0;
                  do {
                    err_msg(ERR_INFOCONT,(char *)0x0,0,"\t\t%.4e",
                            (double)(float)var_thresh[uVar18][uVar19]);
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < veclen[uVar18]);
                }
                err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
                uVar18 = uVar18 + 1;
              } while (uVar18 != n_elem);
              return 0;
            }
          } while( true );
        }
      }
    }
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
          ,0x786,"var_extrema:\n");
  return 0;
}

Assistant:

int
gauden_var_thresh_percentile(vector_t ***var,
			     float32 **var_thresh,
			     uint32 n_mgau,
			     uint32 n_stream,
			     uint32 n_density,
			     const uint32 *veclen,
			     float32 percent)
{
    float32 f = percent / 100.0;
    uint32 ***histo;
    float32 **min;
    float32 **max;
    float32 **bin_wdth;
    uint32 i, j, k, l, b, t;
    float32 gt;

    histo = (uint32 ***)ckd_calloc(n_stream, sizeof(uint32 **));
    min = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));
    max = (float32 **)ckd_calloc(n_stream, sizeof(float32 *));

    for (j = 0; j < n_stream; j++) {
	histo[j] = ckd_calloc(veclen[j], sizeof(uint32 *));
	min[j] = ckd_calloc(veclen[j], sizeof(float32));
	max[j] = ckd_calloc(veclen[j], sizeof(float32));
	for (l = 0; l < veclen[j]; l++) {
	    histo[j][l] = ckd_calloc(N_BIN, sizeof(uint32));
	    max[j][l] = MIN_NEG_FLOAT32;
	    min[j][l] = MAX_POS_FLOAT32;
	}
    }

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    if (var[i][j][k][l] > max[j][l]) {
			max[j][l] = var[i][j][k][l];
		    }
		    if ((var[i][j][k][l] > 0) && (var[i][j][k][l] < min[j][l])) {
			min[j][l] = var[i][j][k][l];
		    }
		}
	    }
	}
    }

    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t[%.4e %.4e]", min[j][l], max[j][l]);
	}
        E_INFOCONT("\n");
    }

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    max[j][l] = (max[j][l] - min[j][l]) / (float32)N_BIN;
	}
    }

    bin_wdth = max;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] > 0) {
			b = (uint32)floor((var[i][j][k][l] - min[j][l]) / bin_wdth[j][l]);
			++histo[j][l][b];
		    }
		}
	    }
	}
    }

    /* grand total # of variances for each stream */
    gt = n_mgau * n_density;

    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {
	    t = 0;
	    for (b = 0; b < N_BIN; b++) {
		t += histo[j][l][b];
		if (((float32)t / gt) > f)
		    break;
	    }
	    var_thresh[j][l] = min[j][l] + (b+1) * bin_wdth[j][l];
	}
    }
    
    E_INFO("var_extrema:\n");
    for (j = 0; j < n_stream; j++) {
	E_INFOCONT("\tstream %u: ", j);
	for (l = 0; l < veclen[j]; l++) {
	    E_INFOCONT("\t\t%.4e", var_thresh[j][l]);
	}
        E_INFOCONT("\n");
    }

    return S3_SUCCESS;
}